

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  __uid_t __uid;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  char *first;
  char cVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  int local_10a8;
  char *local_10a0;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  
  first = *loginp;
  if (first == (char *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = *first != '\0';
  }
  local_10a0 = *passwordp;
  iVar9 = 1;
  pcVar7 = netrcfile;
  if (netrcfile == (char *)0x0) {
    pcVar6 = curl_getenv("HOME");
    if (pcVar6 == (char *)0x0) {
      __uid = geteuid();
      iVar5 = getpwuid_r(__uid,(passwd *)&pw,pwbuf,0x400,(passwd **)&pw_res);
      if (iVar5 != 0) {
        return 1;
      }
      if (pw_res == (passwd *)0x0) {
        return 1;
      }
      pcVar6 = (*Curl_cstrdup)(pw.pw_dir);
      if (pcVar6 == (char *)0x0) {
        return 0x1b;
      }
    }
    pcVar7 = curl_maprintf("%s%s%s",pcVar6,"/",".netrc");
    (*Curl_cfree)(pcVar6);
    if (pcVar7 == (char *)0x0) {
      return -1;
    }
  }
  __stream = fopen64(pcVar7,"r");
  if (netrcfile == (char *)0x0) {
    (*Curl_cfree)(pcVar7);
  }
  if (__stream != (FILE *)0x0) {
    iVar9 = 1;
    bVar3 = false;
    bVar4 = false;
    cVar8 = '\0';
    bVar1 = false;
    bVar2 = false;
    local_10a8 = 0;
    bVar11 = false;
    while (!bVar11) {
      do {
        pcVar7 = fgets(pwbuf,0x1000,__stream);
        if (pcVar7 == (char *)0x0) goto LAB_0038b565;
        pcVar7 = strtok_r(pwbuf," \t\n",&pw.pw_name);
      } while ((pcVar7 != (char *)0x0) && (*pcVar7 == '#'));
      while ((bVar11 = pcVar7 != (char *)0x0, bVar11 &&
             (((first == (char *)0x0 || (local_10a0 == (char *)0x0 || *first == '\0')) ||
              (*local_10a0 == '\0'))))) {
        if (cVar8 == '\x02') {
          if (bVar1) {
            if (bVar10) {
              local_10a8 = Curl_strcasecompare(first,pcVar7);
              bVar1 = false;
            }
            else {
              if (bVar3) {
                (*Curl_cfree)(first);
                bVar3 = false;
              }
              first = (*Curl_cstrdup)(pcVar7);
              bVar1 = false;
              if (first == (char *)0x0) {
                first = (char *)0x0;
LAB_0038b64c:
                iVar9 = -1;
                goto LAB_0038b56d;
              }
              bVar3 = true;
            }
          }
          else {
            if (bVar2) {
              bVar1 = false;
              if ((bool)(bVar10 & local_10a8 == 0)) {
                cVar8 = '\x02';
                bVar2 = false;
                local_10a8 = 0;
                goto LAB_0038b448;
              }
              if (bVar4) {
                (*Curl_cfree)(local_10a0);
                bVar4 = false;
              }
              local_10a0 = (*Curl_cstrdup)(pcVar7);
              if (local_10a0 == (char *)0x0) {
                local_10a0 = (char *)0x0;
                goto LAB_0038b64c;
              }
              bVar4 = true;
              cVar8 = '\x02';
LAB_0038b513:
              bVar1 = false;
              bVar2 = false;
              goto LAB_0038b448;
            }
            iVar5 = Curl_strcasecompare("login",pcVar7);
            if (iVar5 == 0) {
              iVar5 = Curl_strcasecompare("password",pcVar7);
              bVar1 = false;
              if (iVar5 == 0) {
                iVar5 = Curl_strcasecompare("machine",pcVar7);
                if (iVar5 != 0) {
                  local_10a8 = 0;
                }
                cVar8 = (iVar5 == 0) + '\x01';
                goto LAB_0038b513;
              }
              bVar2 = true;
            }
            else {
              bVar1 = true;
              bVar2 = false;
            }
          }
          cVar8 = '\x02';
        }
        else {
          pcVar6 = host;
          if (cVar8 != '\x01') {
            iVar5 = Curl_strcasecompare("machine",pcVar7);
            if (iVar5 != 0) {
              cVar8 = '\x01';
              goto LAB_0038b448;
            }
            pcVar6 = "default";
          }
          iVar5 = Curl_strcasecompare(pcVar6,pcVar7);
          if (iVar5 != 0) {
            iVar9 = 0;
          }
          cVar8 = (iVar5 != 0) * '\x02';
        }
LAB_0038b448:
        pcVar7 = strtok_r((char *)0x0," \t\n",&pw.pw_name);
      }
    }
LAB_0038b565:
    if (iVar9 == 0) {
      if (bVar3) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = first;
      }
      iVar9 = 0;
      if (bVar4) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = local_10a0;
      }
    }
    else {
LAB_0038b56d:
      if (bVar3) {
        (*Curl_cfree)(first);
      }
      if (bVar4) {
        (*Curl_cfree)(local_10a0);
      }
    }
    fclose(__stream);
  }
  return iVar9;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode = 1;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(!done && tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}